

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoSystem.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::CryptoSystem::Decode(CryptoSystem *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (3 < KVar1) {
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16CryptoSystemType);
    KDataStream::Read<unsigned_short>(stream,&(this->field_1).m_ui16CryptoKey);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void CryptoSystem::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < CRYPTO_SYSTEM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui16CryptoSystemType
           >> m_ui16CryptoKey;
}